

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O1

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,int32_t *long_t,size_t numElements)

{
  char **ppcVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  NotEnoughMemoryException *this_00;
  long lVar5;
  size_t __n;
  undefined8 local_18;
  
  pcVar2 = (this->m_currentPosition).m_currentPosition;
  uVar4 = 0;
  if (this->m_lastDataSize < 4) {
    uVar4 = (ulong)(*(int *)&(this->m_alignPosition).m_currentPosition - (int)pcVar2 & 3);
  }
  local_18 = long_t;
  if ((ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar2) <
      uVar4 + numElements * 4) {
    this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
    exception::NotEnoughMemoryException::NotEnoughMemoryException
              (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
    __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                exception::NotEnoughMemoryException::~NotEnoughMemoryException);
  }
  this->m_lastDataSize = 4;
  if (numElements != 0) {
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + uVar4;
  }
  __n = numElements * 4;
  if (this->m_swapBytes == true) {
    if (0 < (long)__n) {
      pcVar2 = (this->m_currentPosition).m_currentPosition;
      lVar5 = 0;
      do {
        (this->m_currentPosition).m_currentPosition = pcVar2 + lVar5 + 1;
        lVar3 = lVar5 + 4;
        *(char *)((long)&local_18 + lVar5 + 3) = pcVar2[lVar5];
        (this->m_currentPosition).m_currentPosition = pcVar2 + lVar5 + 2;
        *(char *)((long)&local_18 + lVar5 + 2) = (pcVar2 + lVar5 + 2)[-1];
        (this->m_currentPosition).m_currentPosition = pcVar2 + lVar5 + 3;
        *(char *)((long)&local_18 + lVar5 + 1) = (pcVar2 + lVar5 + 3)[-1];
        (this->m_currentPosition).m_currentPosition = pcVar2 + lVar5 + 4;
        *(char *)((long)&local_18 + lVar5) = (pcVar2 + lVar5 + 4)[-1];
        lVar5 = lVar5 + 4;
      } while ((ulong)((long)&local_18 + lVar3) < (long)&local_18 + __n);
    }
  }
  else {
    memcpy(long_t,(this->m_currentPosition).m_currentPosition,__n);
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + __n;
  }
  return this;
}

Assistant:

Cdr& Cdr::deserializeArray(int32_t *long_t, size_t numElements)
{
    size_t align = alignment(sizeof(*long_t));
    size_t totalSize = sizeof(*long_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if((m_lastPosition - m_currentPosition) >= sizeAligned)
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*long_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            char *dst = reinterpret_cast<char*>(&long_t);
            char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*long_t))
            {
                m_currentPosition++ >> dst[3];
                m_currentPosition++ >> dst[2];
                m_currentPosition++ >> dst[1];
                m_currentPosition++ >> dst[0];
            }
        }
        else
        {
            m_currentPosition.rmemcopy(long_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}